

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::tryRead
          (AsyncPipe *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  AsyncCapabilityStream *in_R8;
  ArrayPtr<unsigned_char> local_58;
  AsyncCapabilityStream *local_40;
  AsyncCapabilityStream *s;
  AsyncCapabilityStream *_s242;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  AsyncPipe *this_local;
  
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  if (maxBytes == 0) {
    constPromise<unsigned_long,_0UL>();
  }
  else {
    _s242 = in_R8;
    local_40 = kj::_::readMaybe<kj::AsyncCapabilityStream>
                         ((Maybe<kj::AsyncCapabilityStream_&> *)((long)buffer + 0x20));
    s = local_40;
    if (local_40 == (AsyncCapabilityStream *)0x0) {
      local_58 = arrayPtr<unsigned_char>((uchar *)minBytes_local,(size_t)_s242);
      newAdaptedPromise<kj::AsyncCapabilityStream::ReadResult,kj::(anonymous_namespace)::AsyncPipe::BlockedRead,kj::(anonymous_namespace)::AsyncPipe&,kj::ArrayPtr<unsigned_char>,unsigned_long&>
                ((kj *)&stack0xffffffffffffffb8,(AsyncPipe *)buffer,&local_58,&maxBytes_local);
      Promise<kj::AsyncCapabilityStream::ReadResult>::
      then<kj::(anonymous_namespace)::AsyncPipe::tryRead(void*,unsigned_long,unsigned_long)::_lambda(kj::AsyncCapabilityStream::ReadResult)_1_>
                ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,
                 (Type *)&stack0xffffffffffffffb8);
      Promise<kj::AsyncCapabilityStream::ReadResult>::~Promise
                ((Promise<kj::AsyncCapabilityStream::ReadResult> *)&stack0xffffffffffffffb8);
    }
    else {
      (*(local_40->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[1])
                (this,local_40,minBytes_local,maxBytes_local,_s242);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (minBytes == 0) {
      return constPromise<size_t, 0>();
    } else KJ_IF_SOME(s, state) {
      return s.tryRead(buffer, minBytes, maxBytes);
    } else {
      return newAdaptedPromise<ReadResult, BlockedRead>(
          *this, arrayPtr(reinterpret_cast<byte*>(buffer), maxBytes), minBytes)
          .then([](ReadResult r) { return r.byteCount; });
    }